

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value.c
# Opt level: O0

int json_array_clear(json_t *json)

{
  ulong local_28;
  size_t i;
  json_array_t *array;
  json_t *json_local;
  
  if ((json == (json_t *)0x0) || (json->type != JSON_ARRAY)) {
    json_local._4_4_ = -1;
  }
  else {
    for (local_28 = 0; local_28 < json[1].refcount; local_28 = local_28 + 1) {
      json_decref(*(json_t **)(*(long *)(json + 2) + local_28 * 8));
    }
    json[1].refcount = 0;
    json_local._4_4_ = 0;
  }
  return json_local._4_4_;
}

Assistant:

int json_array_clear(json_t *json)
{
	json_array_t *array;
	size_t i;

	if (!json_is_array(json))
		return -1;
	array = json_to_array(json);

	for (i = 0; i < array->entries; i++)
		json_decref(array->table[i]);

	array->entries = 0;
	return 0;
}